

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O2

Optional<llvm::dwarf::Tag> __thiscall llvm::AppleAcceleratorTable::Entry::getTag(Entry *this)

{
  uint uVar1;
  DWARFFormValue *this_00;
  unsigned_long *puVar2;
  uint uVar3;
  uint uVar4;
  Optional<unsigned_long> OVar5;
  undefined1 local_60 [8];
  Optional<llvm::DWARFFormValue> Tag;
  Optional<unsigned_long> Value;
  
  lookup((Optional<llvm::DWARFFormValue> *)local_60,this,3);
  uVar4 = 0;
  if (Tag.Storage.field_0._40_1_ == '\x01') {
    this_00 = optional_detail::OptionalStorage<llvm::DWARFFormValue,_true>::getValue
                        ((OptionalStorage<llvm::DWARFFormValue,_true> *)local_60);
    OVar5 = DWARFFormValue::getAsUnsignedConstant(this_00);
    Tag.Storage._48_8_ = OVar5.Storage.field_0;
    if (((undefined1  [16])OVar5.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      puVar2 = optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                         ((OptionalStorage<unsigned_long,_true> *)&Tag.Storage.hasVal);
      uVar4 = (uint)*puVar2 & 0xff;
      uVar1 = (uint)*puVar2 & 0xff00;
      uVar3 = 0x10000;
      goto LAB_00d75205;
    }
  }
  uVar3 = 0;
  uVar1 = 0;
LAB_00d75205:
  return (Optional<llvm::dwarf::Tag>)
         (OptionalStorage<llvm::dwarf::Tag,_true>)(uVar4 | uVar3 | uVar1);
}

Assistant:

Optional<dwarf::Tag> AppleAcceleratorTable::Entry::getTag() const {
  Optional<DWARFFormValue> Tag = lookup(dwarf::DW_ATOM_die_tag);
  if (!Tag)
    return None;
  if (Optional<uint64_t> Value = Tag->getAsUnsignedConstant())
    return dwarf::Tag(*Value);
  return None;
}